

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O3

int __thiscall Jupiter::HTTP::Server::Data::process_request(Data *this,HTTPSession *session)

{
  string *this_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  bool bVar1;
  Host *pHVar2;
  size_type sVar3;
  long *plVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  basic_string_view<char,_std::char_traits<char>_> rhs_00;
  basic_string_view<char,_std::char_traits<char>_> rhs_01;
  container_type lines;
  string result;
  container_type local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  begin._M_current = (session->request)._M_dataplus._M_p;
  jessilib::
  split<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_char_*,_const_char_*>
            (&local_88,begin,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(begin._M_current + (session->request)._M_string_length),"\r\n","");
  if (local_88.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_88.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    this_00 = &session->request;
    lVar6 = -1;
    lVar7 = 0;
    lVar8 = 0;
    do {
      lVar9 = lVar8 + 1;
      if (local_88.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar8]._M_len != 0) {
        sVar5 = 0;
        do {
          if (local_88.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar8]._M_str[sVar5] != ' ') {
            local_70._M_string_length = 0;
            local_70.field_2._M_local_buf[0] = '\0';
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                      (&local_70,0x100);
            if (session->keep_alive != false) {
              if (lVar9 == (long)local_88.
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_88.
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4) {
                (session->request)._M_string_length = 0;
                *(session->request)._M_dataplus._M_p = '\0';
              }
              else {
                if (lVar9 == 0) {
                  sVar3 = 0;
                }
                else {
                  plVar4 = (long *)((long)&(local_88.
                                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_len +
                                   lVar7);
                  sVar3 = 0;
                  do {
                    sVar3 = sVar3 + *plVar4 + 2;
                    plVar4 = plVar4 + -2;
                    lVar6 = lVar6 + 1;
                  } while (lVar6 != 0);
                }
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                substr(&local_50,this_00,sVar3,0xffffffffffffffff);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(this_00,&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
              }
              sVar3 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                (this_00,"\r\n\r\n",0,4);
              if (sVar3 != 0xffffffffffffffff) {
                process_request(this,session);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,
                              CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                       local_70.field_2._M_local_buf[0]) + 1);
            }
            goto LAB_0012a8d2;
          }
          sVar5 = sVar5 + 1;
        } while (local_88.
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar8]._M_len != sVar5);
      }
      if (DAT_ffffffffffffffff == ':') {
        rhs._M_str = "HOST";
        rhs._M_len = 4;
        bVar1 = jessilib::equalsi<char,char>
                          ((basic_string_view<char,_std::char_traits<char>_>)
                           ZEXT816(0xffffffffffffffff),rhs);
        if (bVar1) {
          pHVar2 = find_host(this,(string_view)ZEXT816(0));
          session->host = pHVar2;
        }
        else {
          rhs_00._M_str = "CONNECTION";
          rhs_00._M_len = 10;
          bVar1 = jessilib::equalsi<char,char>
                            ((basic_string_view<char,_std::char_traits<char>_>)
                             ZEXT816(0xffffffffffffffff),rhs_00);
          if ((bVar1) &&
             (rhs_01._M_str = "keep-alive", rhs_01._M_len = 10,
             bVar1 = jessilib::equalsi<char,char>
                               ((basic_string_view<char,_std::char_traits<char>_>)ZEXT816(0),rhs_01)
             , bVar1)) {
            session->keep_alive = this->permit_keept_alive;
          }
        }
      }
      lVar6 = lVar6 + -1;
      lVar7 = lVar7 + 0x10;
      lVar8 = lVar9;
    } while (lVar9 != (long)local_88.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_88.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4);
  }
LAB_0012a8d2:
  if (local_88.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int Jupiter::HTTP::Server::Data::process_request(HTTPSession &session) {
	auto lines = jessilib::split_view(session.request, "\r\n"sv);
	HTTPCommand command = HTTPCommand::NONE_SPECIFIED;
	Content *content = nullptr;
	std::string_view query_string;
	std::string_view first_token;
	size_t index = 0;
	size_t span;

	auto get_line_offset = [&session, &lines](size_t index)
	{
		size_t offset = 0;
		while (index != 0)
			offset += lines[--index].size() + 2;
		return offset;
	};

	while (index != lines.size())
	{
		std::string_view line = lines[index++];

		// trim front-end spaces.
		while (!line.empty() && line.front() == ' ') {
			line.remove_prefix(1);
		}

		if (!line.empty()) // end of http request
		{
			std::string result;
			result.reserve(256);
			switch (command)
			{
			case HTTPCommand::GET:
			case HTTPCommand::HEAD:
				if (content != nullptr)
				{
					// 200 (success)
					// TODO: remove referencestring warpper
					std::string* content_result = content->execute(query_string);

					switch (session.version)
					{
					default:
					case HTTPVersion::HTTP_1_0:
						result = "HTTP/1.0 200 OK"sv HTTP_ENDL;
						break;
					case HTTPVersion::HTTP_1_1:
						result = "HTTP/1.1 200 OK"sv HTTP_ENDL;
						break;
					}

					result += "Date: "sv;
					char *time_header = html_time();
					result += time_header;
					delete[] time_header;
					result += HTTP_ENDL;

					result += "Server: "sv JUPITER_VERSION HTTP_ENDL;
					result += "Content-Length: "sv;
					result += std::to_string(content_result->size()); // TODO: to_chars?
					result += HTTP_ENDL;

					if (session.keep_alive)
						result += "Connection: keep-alive"sv HTTP_ENDL;
					else
						result += "Connection: close"sv HTTP_ENDL;

					result += "Content-Type: "sv;
					if (content->type.empty()) {
						result += Jupiter::HTTP::Content::Type::Text::PLAIN;
					}
					else {
						result += content->type;
					}

					if (!content->charset.empty()) {
						result += "; charset="sv;
						result += content->charset;
					}
					result += HTTP_ENDL;

					if (!content->language.empty()) {
						result += "Content-Language: "sv;
						result += content->language;
						result += HTTP_ENDL;
					}

					result += HTTP_ENDL;
					if (command == HTTPCommand::GET)
						result += *content_result;

					if (content->free_result)
						delete content_result;

					session.sock.send(result);
				}
				else
				{
					// 404 (not found)

					switch (session.version)
					{
					default:
					case HTTPVersion::HTTP_1_0:
						result = "HTTP/1.0 404 Not Found"sv HTTP_ENDL;
						break;
					case HTTPVersion::HTTP_1_1:
						result = "HTTP/1.1 404 Not Found"sv HTTP_ENDL;
						break;
					}

					char *time_header = html_time();
					result += "Date: "sv HTTP_ENDL;
					result += time_header;
					delete[] time_header;

					result += "Server: "sv JUPITER_VERSION HTTP_ENDL;

					result += "Content-Length: 0"sv HTTP_ENDL;

					if (session.keep_alive)
						result += "Connection: keep-alive"sv HTTP_ENDL;
					else
						result += "Connection: close"sv HTTP_ENDL;

					result += HTTP_ENDL HTTP_ENDL;
					session.sock.send(result);
				}
				break;
			default:
				break;
			}

			if (session.keep_alive == false) {// not keep-alive -- will be destroyed on return
				break;
			}

			if (index == lines.size()) { // end of packet
				session.request.erase();
			}
			else { // end of request -- another request is following
				// Maybe there's still some value in a shifty string, to avoid substr calls & heap allocations...
				session.request = session.request.substr(get_line_offset(index));
			}

			if (session.request.find(HTTP_REQUEST_ENDING) != std::string::npos) { // there's another full request already received
				return process_request(session);
			}
			break;
		}

		// Not empty
		auto first_split = jessilib::split_once_view(line, ' ');
		first_token = first_split.first;

		if (first_token.back() == ':') { // header field
			first_token.remove_suffix(1); // trim trailing ':'
			if (jessilib::equalsi(first_token, "HOST"sv)) {
				session.host = find_host(first_split.second);
			}
			else if (jessilib::equalsi(first_token, "CONNECTION"sv)) {
				std::string_view connection_type = first_split.second;
				if (jessilib::equalsi(connection_type, "keep-alive"sv)) {
					session.keep_alive = permit_keept_alive;
				}
			}
		}
		else { // command
			if (first_token == "GET"sv) {
				command = HTTPCommand::GET;

				auto second_split = jessilib::split_once_view(first_split.second, ' ');
				query_string = second_split.first;
				span = query_string.find('?'); // repurposing 'span'
				if (span == std::string_view::npos) {
					if (session.host == nullptr) {
						content = find(query_string);
					}
					else {
						content = session.host->find(query_string);
					}
					query_string = std::string_view{};
				}
				else {
					if (session.host == nullptr) {
						content = find(query_string.substr(size_t{ 0 }, span));
					}
					else {
						content = session.host->find(query_string.substr(size_t{ 0 }, span));
					}
					query_string.remove_prefix(span + 1);
					// decode query_string here
				}

				std::string_view protocol_str = second_split.second;
				if (jessilib::equalsi(protocol_str, "http/1.0"sv)) {
					session.version = HTTPVersion::HTTP_1_0;
				}
				else if (jessilib::equalsi(protocol_str, "http/1.1"sv)) {
					session.version = HTTPVersion::HTTP_1_1;
					session.keep_alive = permit_keept_alive;
				}
			}
			else if (first_token == "HEAD"sv) {
				command = HTTPCommand::HEAD;

				auto second_split = jessilib::split_once_view(first_split.second, ' ');
				query_string = second_split.first;
				span = query_string.find('?'); // repurposing 'span'
				if (span == std::string_view::npos) {
					if (session.host == nullptr) {
						content = find(query_string);
					}
					else {
						content = session.host->find(query_string);
					}
					query_string = std::string_view{};
				}
				else {
					if (session.host == nullptr) {
						content = find(query_string.substr(size_t{ 0 }, span));
					}
					else {
						content = session.host->find(query_string.substr(size_t{ 0 }, span));
					}
					query_string.remove_prefix(span + 1);
					// decode query_string here
				}

				std::string_view protocol_str = second_split.second;
				if (jessilib::equalsi(protocol_str, "http/1.0"sv)) {
					session.version = HTTPVersion::HTTP_1_0;
				}
				else if (jessilib::equalsi(protocol_str, "http/1.1"sv)) {
					session.version = HTTPVersion::HTTP_1_1;
					session.keep_alive = permit_keept_alive;
				}
			}
			else
				command = HTTPCommand::UNKNOWN;
		}
	}
	return 0;
}